

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O0

int lj_opt_loop(jit_State *J)

{
  ushort uVar1;
  IRRef ins;
  lua_State *L_00;
  int errcode_00;
  int iVar2;
  int32_t e;
  lua_State *L;
  jit_State *pjStack_60;
  int errcode;
  LoopState lps;
  MSize nsnapmap;
  SnapNo nsnap;
  IRRef nins;
  jit_State *J_local;
  
  ins = (J->cur).nins;
  uVar1 = (J->cur).nsnap;
  lps._20_4_ = (J->cur).nsnapmap;
  lps.J = (jit_State *)0x0;
  lps.subst._0_4_ = 0;
  pjStack_60 = J;
  errcode_00 = lj_vm_cpcall(J->L,0,&stack0xffffffffffffffa0,cploop_opt);
  *(ulong *)&J[-1].penalty[0x25].val =
       *(long *)&J[-1].penalty[0x25].val + (ulong)(uint)lps.subst * -2;
  (**(code **)&J[-1].penalty[0x24].val)
            (J[-1].penalty[0x25].pc.ptr64,lps.J,(ulong)(uint)lps.subst * 2,0);
  if (errcode_00 == 0) {
    J_local._4_4_ = 0;
  }
  else {
    L_00 = J->L;
    if ((((errcode_00 != 2) || (0xfffffff2 < (uint)((int)L_00->top[-1].field_4.it >> 0xf))) ||
        (((int)L_00->top[-1].n | 2U) != 0x1a)) ||
       (iVar2 = J->instunroll + -1, J->instunroll = iVar2, iVar2 < 0)) {
      lj_err_throw(L_00,errcode_00);
    }
    L_00->top = L_00->top + -1;
    loop_undo(J,ins,(uint)uVar1,lps._20_4_);
    J_local._4_4_ = 1;
  }
  return J_local._4_4_;
}

Assistant:

int lj_opt_loop(jit_State *J)
{
  IRRef nins = J->cur.nins;
  SnapNo nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  LoopState lps;
  int errcode;
  lps.J = J;
  lps.subst = NULL;
  lps.sizesubst = 0;
  errcode = lj_vm_cpcall(J->L, NULL, &lps, cploop_opt);
  lj_mem_freevec(J2G(J), lps.subst, lps.sizesubst, IRRef1);
  if (LJ_UNLIKELY(errcode)) {
    lua_State *L = J->L;
    if (errcode == LUA_ERRRUN && tvisnumber(L->top-1)) {  /* Trace error? */
      int32_t e = numberVint(L->top-1);
      switch ((TraceError)e) {
      case LJ_TRERR_TYPEINS:  /* Type instability. */
      case LJ_TRERR_GFAIL:  /* Guard would always fail. */
	/* Unrolling via recording fixes many cases, e.g. a flipped boolean. */
	if (--J->instunroll < 0)  /* But do not unroll forever. */
	  break;
	L->top--;  /* Remove error object. */
	loop_undo(J, nins, nsnap, nsnapmap);
	return 1;  /* Loop optimization failed, continue recording. */
      default:
	break;
      }
    }
    lj_err_throw(L, errcode);  /* Propagate all other errors. */
  }
  return 0;  /* Loop optimization is ok. */
}